

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<true>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  long in_RDI;
  PointIndex point_id_1;
  CornerIndex act_c;
  CornerIndex first_c;
  PointIndex point_id;
  AttributeValueIndex first_vert_id;
  CornerIndex c;
  VertexIndex v;
  int num_new_vertices;
  MeshAttributeCornerTable *in_stack_ffffffffffffff18;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff20;
  MeshAttributeCornerTable *in_stack_ffffffffffffff28;
  CornerIndex in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  *in_stack_ffffffffffffff38;
  vector<bool,_std::allocator<bool>_> *this_00;
  ThisIndexType local_9c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  ThisIndexType local_78;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_74;
  uint local_70;
  ThisIndexType local_6c;
  uint local_68;
  ThisIndexType local_64;
  reference local_60;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_4c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_38;
  uint local_34;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_30;
  uint local_2c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_28;
  uint local_24;
  vector<bool,_std::allocator<bool>_> *local_18;
  
  local_18 = in_RSI;
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           *)0x191468);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           *)0x191476);
  local_24 = 0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_28,0);
  do {
    local_2c = CornerTable::num_vertices((CornerTable *)0x1914a1);
    bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator<(&local_28,&local_2c);
    if (!bVar1) {
      return true;
    }
    local_34 = local_28.value_;
    local_30.value_ =
         (uint)CornerTable::LeftMostCorner
                         ((CornerTable *)in_stack_ffffffffffffff18,(uint)in_stack_ffffffffffffff20);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_30,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    uVar2 = local_24;
    if (!bVar1) {
      local_24 = local_24 + 1;
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_38,uVar2);
      this_00 = local_18;
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_30);
      local_44 = (uint)Mesh::CornerToPointId
                                 ((Mesh *)in_stack_ffffffffffffff28,
                                  (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      local_3c = local_44;
      local_40 = (uint)PointAttribute::mapped_index
                                 ((PointAttribute *)in_stack_ffffffffffffff18,
                                  (PointIndex)(uint)in_stack_ffffffffffffff20);
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                   *)in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
      local_48.value_ = local_30.value_;
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_4c);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
      local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (this_00,(size_type)in_stack_ffffffffffffff38);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_60);
      if (bVar1) {
        local_68 = local_48.value_;
        local_64.value_ = (uint)SwingLeft(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4c,&local_64);
        while (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                 (&local_4c,
                                  (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                  &kInvalidCornerIndex), bVar1) {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_48,&local_4c);
          local_70 = local_4c.value_;
          local_6c.value_ = (uint)SwingLeft(in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4c,&local_6c);
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                            (&local_4c,&local_30);
          if (bVar1) {
            return false;
          }
        }
      }
      uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_38);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_74,uVar2);
      in_stack_ffffffffffffff38 =
           (vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            *)(in_RDI + 0x58);
      uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_48);
      pvVar3 = std::
               vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ::operator[](in_stack_ffffffffffffff38,(ulong)uVar2);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(pvVar3,&local_74);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30.value_),
                  (value_type *)in_stack_ffffffffffffff28);
      local_7c = local_48.value_;
      local_78.value_ =
           (uint)CornerTable::SwingRight
                           ((CornerTable *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4c,&local_78);
      while( true ) {
        bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                          (&local_4c,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                           &kInvalidCornerIndex);
        in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 & 0xffffff;
        if (bVar1) {
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_4c,&local_48);
          in_stack_ffffffffffffff34 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff34);
        }
        if ((char)(in_stack_ffffffffffffff34 >> 0x18) == '\0') break;
        local_84 = local_4c.value_;
        local_80 = (uint)CornerTable::Next((CornerTable *)in_stack_ffffffffffffff28,
                                           in_stack_ffffffffffffff30);
        bVar1 = IsCornerOppositeToSeamEdge
                          (in_stack_ffffffffffffff18,
                           (CornerIndex)(uint)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        uVar2 = local_24;
        if (bVar1) {
          local_24 = local_24 + 1;
          IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_88,uVar2);
          IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                    (&local_38,&local_88);
          in_stack_ffffffffffffff20 = local_18;
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_4c);
          local_94 = (uint)Mesh::CornerToPointId
                                     ((Mesh *)in_stack_ffffffffffffff28,
                                      (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
          in_stack_ffffffffffffff28 = (MeshAttributeCornerTable *)(in_RDI + 0x88);
          local_8c = local_94;
          local_90 = (uint)PointAttribute::mapped_index
                                     ((PointAttribute *)in_stack_ffffffffffffff18,
                                      (PointIndex)(uint)in_stack_ffffffffffffff20);
          std::
          vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ::push_back((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       *)in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30.value_),
                      (value_type *)in_stack_ffffffffffffff28);
        }
        uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_38);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_98,uVar2);
        in_stack_ffffffffffffff18 = (MeshAttributeCornerTable *)(in_RDI + 0x58);
        uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_4c);
        pvVar3 = std::
                 vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ::operator[]((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                               *)in_stack_ffffffffffffff18,(ulong)uVar2);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(pvVar3,&local_98);
        local_9c.value_ =
             (uint)CornerTable::SwingRight
                             ((CornerTable *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4c,&local_9c);
      }
    }
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator++(&local_28);
  } while( true );
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}